

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

unsigned_long om::file::size(string *file_name_)

{
  int iVar1;
  char *__file;
  runtime_error *this;
  int *piVar2;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  stat st;
  string *file_name__local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)file_name_;
  memset(local_a0,0,0x90);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  if (iVar1 < 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar2 = __errno_location();
    std::__cxx11::to_string(&local_e0,*piVar2);
    std::operator+(&local_c0,"size: could not determine file size: errno: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
    std::runtime_error::runtime_error(this,(string *)&local_c0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return st.st_rdev;
}

Assistant:

inline unsigned long size(const std::string& file_name_)
		{
			struct stat st {};

			if (stat(file_name_.c_str(), &st) < 0)
				throw std::runtime_error("size: could not determine file size: errno: "
										 + std::to_string(errno));

			return (unsigned long)(st.st_size);
		}